

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O0

wchar_t open_filename(archive *a,wchar_t mbs_fn,void *filename)

{
  undefined4 *client_data;
  int *piVar1;
  wchar_t local_34;
  wchar_t r;
  write_file_data *mine;
  void *filename_local;
  wchar_t mbs_fn_local;
  archive *a_local;
  
  client_data = (undefined4 *)calloc(1,0x70);
  if (client_data == (undefined4 *)0x0) {
    archive_set_error(a,0xc,"No memory");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    if (mbs_fn == L'\0') {
      local_34 = archive_mstring_copy_wcs((archive_mstring *)(client_data + 2),(wchar_t *)filename);
    }
    else {
      local_34 = archive_mstring_copy_mbs((archive_mstring *)(client_data + 2),(char *)filename);
    }
    if (local_34 < L'\0') {
      piVar1 = __errno_location();
      if (*piVar1 == 0xc) {
        archive_set_error(a,0xc,"No memory");
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        if (mbs_fn == L'\0') {
          archive_set_error(a,-1,"Can\'t convert \'%ls\' to MBS",filename);
        }
        else {
          archive_set_error(a,-1,"Can\'t convert \'%s\' to WCS",filename);
        }
        a_local._4_4_ = L'\xffffffe7';
      }
    }
    else {
      *client_data = 0xffffffff;
      a_local._4_4_ = archive_write_open2(a,client_data,file_open,file_write,file_close,file_free);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
open_filename(struct archive *a, int mbs_fn, const void *filename)
{
	struct write_file_data *mine;
	int r;

	mine = calloc(1, sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	if (mbs_fn)
		r = archive_mstring_copy_mbs(&mine->filename, filename);
	else
		r = archive_mstring_copy_wcs(&mine->filename, filename);
	if (r < 0) {
		if (errno == ENOMEM) {
			archive_set_error(a, ENOMEM, "No memory");
			return (ARCHIVE_FATAL);
		}
		if (mbs_fn)
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "Can't convert '%s' to WCS",
			    (const char *)filename);
		else
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "Can't convert '%ls' to MBS",
			    (const wchar_t *)filename);
		return (ARCHIVE_FAILED);
	}
	mine->fd = -1;
	return (archive_write_open2(a, mine,
		    file_open, file_write, file_close, file_free));
}